

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O3

int __thiscall
mcts::RandomPlayout<ttt::Board>::operator()(RandomPlayout<ttt::Board> *this,Board *game)

{
  int iVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  vector<long,_std::allocator<long>_> moves;
  Board ngame;
  param_type local_58;
  vector<long,_std::allocator<long>_> local_50;
  Board local_38;
  
  if ((operator()(ttt::Board_const&)::rd == '\0') &&
     (iVar1 = __cxa_guard_acquire(&operator()(ttt::Board_const&)::rd), iVar1 != 0)) {
    std::random_device::random_device(&operator()::rd);
    __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
    __cxa_guard_release(&operator()(ttt::Board_const&)::rd);
  }
  if ((operator()(ttt::Board_const&)::gen == '\0') &&
     (iVar1 = __cxa_guard_acquire(&operator()(ttt::Board_const&)::gen), iVar1 != 0)) {
    uVar3 = std::random_device::_M_getval();
    uVar4 = (ulong)uVar3;
    lVar5 = 1;
    operator()::gen._M_x[0] = uVar4;
    do {
      uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
      operator()::gen._M_x[lVar5] = uVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    operator()::gen._M_p = 0x270;
    __cxa_guard_release(&operator()(ttt::Board_const&)::gen);
  }
  local_38._8_2_ = *(undefined2 *)((game->board)._M_elems[2]._M_elems + 2);
  local_38.board._M_elems._0_8_ = *(undefined8 *)(game->board)._M_elems;
  iVar1 = ttt::Board::GetStatus(&local_38);
  if (iVar1 == -1) {
    do {
      ttt::Board::GetPossibleMoves(&local_50,&local_38);
      local_58._M_b =
           (int)((ulong)((long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) + -1;
      local_58._M_a = 0;
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_58,&operator()::gen,&local_58);
      ttt::Board::ApplyMove
                (&local_38,
                 local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start + rVar2);
      iVar1 = ttt::Board::GetStatus(&local_38);
      if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (iVar1 == -1);
  }
  return iVar1;
}

Assistant:

int
RandomPlayout<IGame>::operator()(const IGame &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        auto moves = ngame.GetPossibleMoves();
        ngame.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        status = ngame.GetStatus();
    }
    return status;
}